

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O2

void stream(void)

{
  ostream *poVar1;
  savebuf sbuf;
  string local_a0;
  savebuf local_80;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\n");
  poVar1 = std::operator<<(poVar1,"======================================================");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"     STREAM                                           ");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"======================================================");
  poVar1 = std::operator<<(poVar1,"\n");
  std::operator<<(poVar1,"\n");
  agr::savebuf::savebuf(&local_80,*(streambuf **)(*(long *)(std::cout + -0x18) + 0x106168));
  std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  std::operator<<((ostream *)&std::cout,"This string");
  std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  poVar1 = std::operator<<((ostream *)&std::cout,"\nI have saved: ");
  agr::savebuf::str_abi_cxx11_(&local_a0,&local_80);
  poVar1 = std::operator<<(poVar1,(string *)&local_a0);
  std::operator<<(poVar1,"\n\n");
  std::__cxx11::string::~string((string *)&local_a0);
  agr::savebuf::~savebuf(&local_80);
  return;
}

Assistant:

void stream()
 {
  std::cout << "\n" << "======================================================" << "\n"
                      << "     STREAM                                           " << "\n"
                      << "======================================================" << "\n"

                      << "\n";

  //Store the output of a stream using the savebuf class
  std::streambuf* coutbuf = std::cout.rdbuf();
  agr::savebuf sbuf( coutbuf );
  std::cout.rdbuf( &sbuf );
  std::cout << "This string";
  std::cout.rdbuf( coutbuf ); // restore the original stream buffer
  std::cout << "\nI have saved: " << sbuf.str() << "\n\n";
 }